

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManFlowMinCut(Aig_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  
  uVar1 = p->nRegs;
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  uVar10 = 8;
  if (6 < uVar1 - 1) {
    uVar10 = (ulong)uVar1;
  }
  pVVar3->nSize = 0;
  iVar8 = (int)uVar10;
  pVVar3->nCap = iVar8;
  if (iVar8 == 0) {
    ppvVar4 = (void **)0x0;
  }
  else {
    ppvVar4 = (void **)malloc((long)iVar8 << 3);
  }
  pVVar3->pArray = ppvVar4;
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    iVar8 = 0;
    lVar7 = 0;
    do {
      pvVar2 = pVVar5->pArray[lVar7];
      if ((((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x28) != 0)) &&
          (*(int *)((long)pvVar2 + 0x20) == p->nTravIds)) &&
         (((*(byte *)((long)pvVar2 + 0x18) & 0x10) != 0 ||
          (*(int *)(*(long *)((long)pvVar2 + 0x28) + 0x20) != p->nTravIds)))) {
        iVar9 = (int)uVar10;
        if (iVar8 == iVar9) {
          if (iVar9 < 0x10) {
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(0x80);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = 0x10;
            uVar10 = 0x10;
          }
          else {
            uVar10 = (ulong)(uint)(iVar9 * 2);
            if (pVVar3->pArray == (void **)0x0) {
              ppvVar4 = (void **)malloc(uVar10 * 8);
            }
            else {
              ppvVar4 = (void **)realloc(pVVar3->pArray,uVar10 * 8);
            }
            pVVar3->pArray = ppvVar4;
            pVVar3->nCap = iVar9 * 2;
          }
        }
        else {
          ppvVar4 = pVVar3->pArray;
        }
        lVar6 = (long)iVar8;
        iVar8 = iVar8 + 1;
        pVVar3->nSize = iVar8;
        ppvVar4[lVar6] = pvVar2;
        pVVar5 = p->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar5->nSize);
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Llb_ManFlowMinCut( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    // collect the cut nodes
    vMinCut = Vec_PtrAlloc( Aig_ManRegNum(p) );
    Aig_ManForEachObj( p, pObj, i )
    {
        // node without flow is not a cut node
        if ( !Llb_ObjGetPath(pObj) )
            continue;
        // unvisited node is below the cut
        if ( !Aig_ObjIsTravIdCurrent(p, pObj) )
            continue;
        // add terminal with flow or node whose path is not visited
        if ( pObj->fMarkA || !Aig_ObjIsTravIdCurrent( p, Llb_ObjGetPath(pObj) ) )
            Vec_PtrPush( vMinCut, pObj );
    }
    return vMinCut;
}